

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpx_rac.c
# Opt level: O2

int vpx_rac_get_uint(VpxRangeCoder *c,int bits)

{
  int iVar1;
  int value;
  int iVar2;
  bool bVar3;
  
  iVar2 = 0;
  while (bVar3 = bits != 0, bits = bits + -1, bVar3) {
    iVar1 = vpx_rac_get(c);
    iVar2 = iVar1 + iVar2 * 2;
  }
  return iVar2;
}

Assistant:

int vpx_rac_get_uint(VpxRangeCoder *c, int bits)
{
    int value = 0;

    while (bits--) {
        value = (value << 1) | vpx_rac_get(c);
    }

    return value;
}